

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWriteBarrierManager.cpp
# Opt level: O0

void Memory::RecyclerWriteBarrierManager::WriteBarrier(void *address)

{
  bool bVar1;
  uintptr_t uVar2;
  uintptr_t index;
  void *address_local;
  
  VerifyIsBarrierAddress(address);
  uVar2 = GetCardTableIndex(address);
  cardTable[uVar2] = cardTable[uVar2] | 1;
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,SWBPhase);
  if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
    Output::Print(L"Writing to 0x%p (CIndex: %u)\n",address,uVar2);
  }
  return;
}

Assistant:

void
RecyclerWriteBarrierManager::WriteBarrier(void * address)
{
    if (IS_ASAN_FAKE_STACK_ADDR(address))
    {
        return;
    }

#ifdef RECYCLER_WRITE_BARRIER_BYTE
#if ENABLE_DEBUG_CONFIG_OPTIONS
    VerifyIsBarrierAddress(address);
#endif
    const uintptr_t index = GetCardTableIndex(address);
    cardTable[index] |= DIRTYBIT;
#else
    uint bitShift = (((uint)address) >> s_BitArrayCardTableShift);
    uint bitMask = 1 << bitShift;
    const uint cardIndex = ((uint) address) / (s_BytesPerCard);
    cardTable[cardIndex] |= bitMask;
#endif
#if DBG_DUMP
    // Global to process, use global configuration here
    if (PHASE_VERBOSE_TRACE1(Js::SWBPhase))
    {
        Output::Print(_u("Writing to 0x%p (CIndex: %u)\n"), address, index);
    }
#endif
}